

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O0

optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> * __thiscall
tinyusdz::crate::CrateValue::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
           *__return_storage_ptr__,CrateValue *this)

{
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_38;
  CrateValue *local_18;
  CrateValue *this_local;
  
  local_18 = this;
  this_local = (CrateValue *)__return_storage_ptr__;
  tinyusdz::value::Value::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_38,&this->value_,false);
  nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_0>
            (__return_storage_ptr__,&local_38);
  nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
  ~optional(&local_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }